

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

int Rtm_ManMarkAutoFwd(Rtm_Man_t *pRtm)

{
  int iVar1;
  Rtm_Obj_t *pRVar2;
  void *pvVar3;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Rtm_Obj_t *pObjRtm;
  Rtm_Man_t *pRtm_local;
  
  local_20 = 0;
  pRVar2 = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vObjs,0);
  Rtm_ObjMarkAutoFwd_rec(pRVar2);
  for (local_1c = 0; iVar1 = Vec_PtrSize(pRtm->vPis), local_1c < iVar1; local_1c = local_1c + 1) {
    pRVar2 = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vPis,local_1c);
    Rtm_ObjMarkAutoFwd_rec(pRVar2);
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(pRtm->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar3 = Vec_PtrEntry(pRtm->vObjs,local_1c);
    *(uint *)((long)pvVar3 + 8) =
         *(uint *)((long)pvVar3 + 8) & 0xffffffef |
         (uint)((*(uint *)((long)pvVar3 + 8) >> 4 & 1) == 0) << 4;
    local_20 = (*(uint *)((long)pvVar3 + 8) >> 4 & 1) + local_20;
  }
  return local_20;
}

Assistant:

int Rtm_ManMarkAutoFwd( Rtm_Man_t * pRtm )
{
    Rtm_Obj_t * pObjRtm;
    int i, Counter = 0;
    // mark nodes reachable from the PIs
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    Rtm_ObjMarkAutoFwd_rec( pObjRtm );
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        Rtm_ObjMarkAutoFwd_rec( pObjRtm );
    // count the number of autonomous nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    {
        pObjRtm->fAuto = !pObjRtm->fAuto;
        Counter += pObjRtm->fAuto;
    }
    // mark the fanins of the autonomous nodes
    return Counter;
}